

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_thread.hpp
# Opt level: O0

void oqpi::posix_thread::set_core_affinity_mask
               (native_handle_type handle,core_affinity affinityMask)

{
  uint32_t uVar1;
  eAssertResult eVar2;
  uint uVar3;
  ulong uVar4;
  int error;
  eAssertResult assertResult;
  cpu_set_t set;
  core_affinity affinityMask_local;
  native_handle_type handle_local;
  
  set.__bits[0xf]._4_4_ = affinityMask;
  memset(&error,0,0x80);
  memset(&error,0,0x80);
  error = set.__bits[0xf]._4_4_;
  if ((((set_core_affinity_mask::always_ignore & 1U) == 0) &&
      (uVar4 = (ulong)set.__bits[0xf]._4_4_, uVar1 = hardware_concurrency(),
      (ulong)(1L << ((byte)uVar1 & 0x3f)) <= uVar4)) && (set.__bits[0xf]._4_4_ != all_cores)) {
    eVar2 = assert_function("/workspace/llm4binary/github/license_c_cmakelists/H-EAL[P]oqpi/include/oqpi/threading/posix_thread.hpp"
                            ,0x129,
                            "(static_cast<uint64_t>(affinityMask) < (1ull << hardware_concurrency()) || affinityMask == core_affinity::all_cores)"
                            ,"");
    if (eVar2 == eAR_Retry) {
      debugger_break();
    }
    else if (eVar2 == eAR_AlwaysIgnore) {
      set_core_affinity_mask::always_ignore = true;
    }
  }
  uVar3 = pthread_setaffinity_np(handle,0x80,(cpu_set_t *)&error);
  if (uVar3 != 0) {
    fprintf(_stderr,"[error  ] pthread_setaffinity_np failed with error code %d\n",(ulong)uVar3);
  }
  return;
}

Assistant:

static void set_core_affinity_mask(native_handle_type handle, core_affinity affinityMask)
        {
            auto set = cpu_set_t{};
            // Clears set, so that it contains no CPUs.
            CPU_ZERO(&set);
            memcpy(&set.__bits, &affinityMask, sizeof(affinityMask));

            // Make sure the selected mask is valid
            oqpi_check(static_cast<uint64_t>(affinityMask) < (1ull << hardware_concurrency()) || affinityMask == core_affinity::all_cores);

            const auto error = pthread_setaffinity_np(handle, sizeof(cpu_set_t), &set);
            if(error != 0)
            {
                oqpi_error("pthread_setaffinity_np failed with error code %d", error);
            }
        }